

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_bind(runtime_type *this,token_base *a,var *b)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  token_base **pptVar6;
  token_base *in_RCX;
  runtime_type *in_RDX;
  runtime_type *in_RDI;
  size_t i;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *arr;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *pl;
  undefined1 in_stack_0000081f;
  iterator *in_stack_00000820;
  runtime_type *in_stack_00000828;
  string *in_stack_fffffffffffffed8;
  runtime_error *in_stack_fffffffffffffee0;
  var *in_stack_ffffffffffffff18;
  allocator *paVar7;
  runtime_type *this_00;
  tree_node *local_b0;
  undefined8 in_stack_ffffffffffffff60;
  ulong local_98;
  allocator local_89;
  string local_88 [32];
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_68;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [24];
  var *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  cs_impl::any::type((any *)in_stack_fffffffffffffee0);
  bVar1 = std::type_info::operator!=
                    ((type_info *)in_stack_fffffffffffffee0,(type_info *)in_stack_fffffffffffffed8);
  if (bVar1) {
    local_55 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    paVar7 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Only support structured binding with array.",paVar7);
    runtime_error::runtime_error(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_55 = 0;
    __cxa_throw(uVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_60 = token_parallel::get_parallel((token_parallel *)in_RDX);
  local_68 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                       ((any *)in_stack_ffffffffffffff60);
  sVar3 = std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                  *)0x51c5b7);
  sVar4 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x51c5c9);
  if (sVar3 != sVar4) {
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Unmatched structured binding.",&local_89);
    runtime_error::runtime_error(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    __cxa_throw(uVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_98 = 0;
  while( true ) {
    sVar3 = std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                    *)0x51c6da);
    if (sVar3 <= local_98) break;
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                *)in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8);
    tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffed8);
    pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_RDI);
    iVar2 = (*(*pptVar6)->_vptr_token_base[2])();
    if (iVar2 == 0xf) {
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                    *)in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8);
      local_b0 = (tree_node *)
                 tree_type<cs::token_base_*>::root
                           ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffed8);
      tree_type<cs::token_base_*>::iterator::data((iterator *)in_RDI);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffee0,
                 (size_type)in_stack_fffffffffffffed8);
      parse_bind(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      cs_impl::any::~any((any *)0x51c79b);
    }
    else {
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                    *)in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8);
      tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffed8);
      in_stack_fffffffffffffee0 = (runtime_error *)&stack0xffffffffffffff40;
      parse_expr(in_stack_00000828,in_stack_00000820,(bool)in_stack_0000081f);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffee0,
                 (size_type)in_stack_fffffffffffffed8);
      parse_asi(this_00,(var *)in_RDI,in_stack_ffffffffffffff18);
      cs_impl::any::~any((any *)0x51c815);
      cs_impl::any::~any((any *)0x51c81f);
    }
    local_98 = local_98 + 1;
  }
  cs_impl::any::any((any *)in_stack_fffffffffffffee0,(any *)in_stack_fffffffffffffed8);
  return (var)(proxy *)this_00;
}

Assistant:

var runtime_type::parse_bind(token_base *a, const var &b)
	{
		if (b.type() != typeid(array))
			throw runtime_error("Only support structured binding with array.");
		auto &pl = static_cast<token_parallel *>(a)->get_parallel();
		auto &arr = b.const_val<array>();
		if (pl.size() != arr.size())
			throw runtime_error("Unmatched structured binding.");
		for (std::size_t i = 0; i < pl.size(); ++i) {
			if (pl[i].root().data()->get_type() == token_types::parallel)
				parse_bind(pl[i].root().data(), arr[i]);
			else
				parse_asi(parse_expr(pl[i].root()), arr[i]);
		}
		return b;
	}